

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  size_t k;
  int iVar5;
  int iVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  vbool<4> vVar9;
  char cVar10;
  undefined4 in_EAX;
  uint uVar11;
  size_t mask;
  ulong uVar12;
  undefined4 uVar13;
  int iVar14;
  ulong uVar15;
  Intersectors *pIVar16;
  Intersectors *pIVar17;
  Intersectors *extraout_RDX;
  ulong uVar18;
  Intersectors *pIVar19;
  NodeRef *pNVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  Intersectors *pIVar22;
  bool bVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar42;
  float fVar43;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar48;
  float fVar49;
  undefined1 auVar45 [16];
  float fVar50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar46;
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar53 [16];
  float fVar57;
  float fVar60;
  float fVar62;
  float fVar64;
  undefined1 auVar58 [16];
  uint uVar61;
  uint uVar63;
  uint uVar65;
  undefined1 auVar59 [16];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar73;
  float fVar74;
  undefined1 auVar71 [16];
  float fVar75;
  undefined1 auVar72 [16];
  vfloat4 a0;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar83;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar92;
  undefined1 auVar93 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  TravRayK<4,_false> *tray_00;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar47 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar51 = *(undefined1 (*) [16])(ray + 0x80);
    auVar45._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar51._0_4_);
    auVar45._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar51._4_4_);
    auVar45._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar51._8_4_);
    auVar45._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar51._12_4_);
    uVar11 = movmskps(in_EAX,auVar45);
    if (uVar11 != 0) {
      uVar12 = (ulong)(uVar11 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar57 = tray.dir.field_0._0_4_;
      fVar60 = tray.dir.field_0._4_4_;
      fVar62 = tray.dir.field_0._8_4_;
      fVar64 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar44 = tray.dir.field_0._16_4_;
      fVar48 = tray.dir.field_0._20_4_;
      fVar49 = tray.dir.field_0._24_4_;
      fVar50 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar52 = tray.dir.field_0._32_4_;
      fVar54 = tray.dir.field_0._36_4_;
      fVar55 = tray.dir.field_0._40_4_;
      fVar56 = tray.dir.field_0._44_4_;
      auVar71._0_4_ = fVar44 * fVar44 + fVar52 * fVar52;
      auVar71._4_4_ = fVar48 * fVar48 + fVar54 * fVar54;
      auVar71._8_4_ = fVar49 * fVar49 + fVar55 * fVar55;
      auVar71._12_4_ = fVar50 * fVar50 + fVar56 * fVar56;
      auVar76._0_4_ = fVar57 * fVar57 + auVar71._0_4_;
      auVar76._4_4_ = fVar60 * fVar60 + auVar71._4_4_;
      auVar76._8_4_ = fVar62 * fVar62 + auVar71._8_4_;
      auVar76._12_4_ = fVar64 * fVar64 + auVar71._12_4_;
      auVar71 = rsqrtps(auVar71,auVar76);
      fVar70 = auVar71._0_4_;
      fVar25 = auVar71._4_4_;
      fVar26 = auVar71._8_4_;
      fVar42 = auVar71._12_4_;
      pre.depth_scale.field_0.v[0] = fVar70 * fVar70 * auVar76._0_4_ * -0.5 * fVar70 + fVar70 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar25 * fVar25 * auVar76._4_4_ * -0.5 * fVar25 + fVar25 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar26 * fVar26 * auVar76._8_4_ * -0.5 * fVar26 + fVar26 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar42 * fVar42 * auVar76._12_4_ * -0.5 * fVar42 + fVar42 * 1.5
      ;
      do {
        lVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar76 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar76 = insertps(auVar76,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar70 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar77._0_4_ = auVar76._0_4_ * fVar70;
        auVar77._4_4_ = auVar76._4_4_ * fVar70;
        auVar77._8_4_ = auVar76._8_4_ * fVar70;
        auVar77._12_4_ = auVar76._12_4_ * fVar70;
        uVar15 = CONCAT44(auVar77._4_4_,auVar77._4_4_);
        auVar27._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar27._8_4_ = -auVar77._12_4_;
        auVar27._12_4_ = -auVar77._12_4_;
        auVar76 = blendps(auVar27,ZEXT816(0),0xe);
        auVar91._4_4_ = auVar76._0_4_;
        auVar91._0_4_ = auVar77._8_4_;
        auVar91._8_4_ = auVar76._4_4_;
        auVar91._12_4_ = 0;
        auVar90._4_4_ = auVar76._0_4_;
        auVar90._0_4_ = auVar77._8_4_;
        auVar90._8_4_ = auVar76._4_4_;
        auVar90._12_4_ = 0;
        auVar90 = dpps(auVar90 << 0x20,auVar91 << 0x20,0x7f);
        uVar15 = CONCAT44(auVar77._12_4_,auVar77._8_4_);
        auVar79._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar79._8_4_ = -auVar77._8_4_;
        auVar79._12_4_ = -auVar77._12_4_;
        auVar71 = insertps(auVar79,auVar77,0x2a);
        auVar76 = dpps(auVar71,auVar71,0x7f);
        iVar24 = -(uint)(auVar76._0_4_ < auVar90._0_4_);
        auVar28._4_4_ = iVar24;
        auVar28._0_4_ = iVar24;
        auVar28._8_4_ = iVar24;
        auVar28._12_4_ = iVar24;
        auVar76 = blendvps(auVar71,auVar91 << 0x20,auVar28);
        auVar71 = dpps(auVar76,auVar76,0x7f);
        auVar91 = rsqrtss(auVar71,auVar71);
        fVar25 = auVar91._0_4_;
        fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * auVar71._0_4_ * 0.5 * fVar25;
        fVar26 = fVar25 * auVar76._0_4_;
        fVar42 = fVar25 * auVar76._4_4_;
        fVar43 = fVar25 * auVar76._8_4_;
        fVar25 = fVar25 * auVar76._12_4_;
        fVar78 = fVar42 * auVar77._0_4_ - auVar77._4_4_ * fVar26;
        fVar81 = fVar43 * auVar77._4_4_ - auVar77._8_4_ * fVar42;
        fVar82 = fVar26 * auVar77._8_4_ - auVar77._0_4_ * fVar43;
        auVar80._12_4_ = fVar25 * auVar77._12_4_ - auVar77._12_4_ * fVar25;
        auVar80._0_8_ = CONCAT44(fVar82,fVar81);
        auVar80._8_4_ = fVar78;
        auVar84._8_4_ = fVar78;
        auVar84._0_8_ = auVar80._0_8_;
        auVar84._12_4_ = auVar80._12_4_;
        auVar76 = dpps(auVar84,auVar80,0x7f);
        pIVar19 = (Intersectors *)(uVar12 - 1);
        pIVar16 = (Intersectors *)(lVar4 * 0x30);
        auVar71 = rsqrtss(auVar76,auVar76);
        fVar25 = auVar71._0_4_;
        fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * auVar76._0_4_ * 0.5 * fVar25;
        aVar29.m128[1] = fVar25 * fVar78;
        aVar29.m128[0] = fVar43;
        aVar29.m128[2] = auVar77._8_4_ * fVar70;
        aVar29.m128[3] = 0.0;
        pre.ray_space[lVar4].vx.field_0.m128[0] = fVar26;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar25 * fVar81;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar77._0_4_ * fVar70;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar7.m128[1] = fVar25 * fVar82;
        aVar7.m128[0] = fVar42;
        aVar7.m128[2] = auVar77._4_4_ * fVar70;
        aVar7.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar7;
        pre.ray_space[lVar4].vz.field_0 = aVar29;
        uVar12 = uVar12 & (ulong)pIVar19;
      } while (uVar12 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar70 = (float)DAT_01ff1d40;
      fVar25 = DAT_01ff1d40._4_4_;
      fVar26 = DAT_01ff1d40._8_4_;
      fVar42 = DAT_01ff1d40._12_4_;
      auVar30._4_4_ = -(uint)(ABS(fVar60) < fVar25);
      auVar30._0_4_ = -(uint)(ABS(fVar57) < fVar70);
      auVar30._8_4_ = -(uint)(ABS(fVar62) < fVar26);
      auVar30._12_4_ = -(uint)(ABS(fVar64) < fVar42);
      auVar90 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar30)
      ;
      auVar31._4_4_ = -(uint)(ABS(fVar48) < fVar25);
      auVar31._0_4_ = -(uint)(ABS(fVar44) < fVar70);
      auVar31._8_4_ = -(uint)(ABS(fVar49) < fVar26);
      auVar31._12_4_ = -(uint)(ABS(fVar50) < fVar42);
      auVar71 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar31)
      ;
      auVar32._4_4_ = -(uint)(ABS(fVar54) < fVar25);
      auVar32._0_4_ = -(uint)(ABS(fVar52) < fVar70);
      auVar32._8_4_ = -(uint)(ABS(fVar55) < fVar26);
      auVar32._12_4_ = -(uint)(ABS(fVar56) < fVar42);
      auVar91 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar32)
      ;
      auVar76 = rcpps(auVar32,auVar90);
      fVar44 = auVar76._0_4_;
      auVar58._0_4_ = auVar90._0_4_ * fVar44;
      fVar48 = auVar76._4_4_;
      auVar58._4_4_ = auVar90._4_4_ * fVar48;
      fVar49 = auVar76._8_4_;
      auVar58._8_4_ = auVar90._8_4_ * fVar49;
      fVar50 = auVar76._12_4_;
      auVar58._12_4_ = auVar90._12_4_ * fVar50;
      tray.rdir.field_0._0_4_ = (1.0 - auVar58._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._4_4_ = (1.0 - auVar58._4_4_) * fVar48 + fVar48;
      tray.rdir.field_0._8_4_ = (1.0 - auVar58._8_4_) * fVar49 + fVar49;
      tray.rdir.field_0._12_4_ = (1.0 - auVar58._12_4_) * fVar50 + fVar50;
      auVar76 = rcpps(auVar58,auVar71);
      fVar44 = auVar76._0_4_;
      fVar48 = auVar76._4_4_;
      fVar49 = auVar76._8_4_;
      fVar50 = auVar76._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar71._0_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._20_4_ = (1.0 - auVar71._4_4_ * fVar48) * fVar48 + fVar48;
      tray.rdir.field_0._24_4_ = (1.0 - auVar71._8_4_ * fVar49) * fVar49 + fVar49;
      tray.rdir.field_0._28_4_ = (1.0 - auVar71._12_4_ * fVar50) * fVar50 + fVar50;
      auVar76 = rcpps(auVar76,auVar91);
      fVar44 = auVar76._0_4_;
      fVar48 = auVar76._4_4_;
      fVar49 = auVar76._8_4_;
      fVar50 = auVar76._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar91._0_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._36_4_ = (1.0 - auVar91._4_4_ * fVar48) * fVar48 + fVar48;
      tray.rdir.field_0._40_4_ = (1.0 - auVar91._8_4_ * fVar49) * fVar49 + fVar49;
      tray.rdir.field_0._44_4_ = (1.0 - auVar91._12_4_ * fVar50) * fVar50 + fVar50;
      auVar53._0_12_ = ZEXT812(0);
      auVar53._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar33._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar33._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar33._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar33._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar33);
      auVar34._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar34._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar34._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar34._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar34);
      auVar76 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar51 = maxps(auVar51,auVar53);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar76,auVar45);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar51,auVar45);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar51 ^ auVar45);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pIVar22 = (Intersectors *)0x3;
      }
      else {
        pIVar22 = (Intersectors *)
                  ((ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2);
      }
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar24 = 0x224ff80;
      aVar92 = _DAT_01feb9f0;
      do {
        paVar21 = paVar21 + -1;
        root.ptr = pNVar20[-1].ptr;
        pNVar20 = pNVar20 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0024f92e:
          iVar24 = 3;
        }
        else {
          aVar46.v = *(__m128 *)paVar21->v;
          auVar35._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
          auVar35._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
          auVar35._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
          auVar35._12_4_ = -(uint)(aVar46.v[3] < tray.tfar.field_0.v[3]);
          uVar11 = movmskps(iVar24,auVar35);
          if (uVar11 == 0) {
            iVar24 = 2;
          }
          else {
            uVar12 = (ulong)(uVar11 & 0xff);
            pIVar17 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar11 & 0xff);
            iVar24 = 0;
            if (pIVar17 <= pIVar22) {
              do {
                k = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> k & 1) == 0; k = k + 1) {
                  }
                }
                tray_00 = &tray;
                pIVar19 = This;
                pIVar16 = (Intersectors *)context;
                bVar23 = occluded1(This,bvh,root,k,&pre,ray,tray_00,context);
                if (bVar23) {
                  terminated.field_0.i[k] = -1;
                }
                uVar12 = uVar12 & uVar12 - 1;
              } while (uVar12 != 0);
              iVar14 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar24 = 3;
              aVar92 = _DAT_01feb9f0;
              if (iVar14 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar24 = 2;
              }
            }
            vVar9.field_0 = terminated.field_0;
            if (pIVar22 < pIVar17) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0024f92e;
                  auVar41._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
                  auVar41._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
                  auVar41._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
                  auVar41._12_4_ = -(uint)(aVar46.v[3] < tray.tfar.field_0.v[3]);
                  iVar24 = movmskps(iVar24,auVar41);
                  if (iVar24 == 0) {
                    iVar24 = 2;
                    aVar92 = _DAT_01feb9f0;
                  }
                  else {
                    bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                    uVar12 = (ulong)bVar1;
                    pvVar3 = This->leafIntersector;
                    local_17b8 = auVar47._0_8_;
                    uStack_17b0 = auVar47._8_8_;
                    valid_o.field_0._0_8_ = local_17b8;
                    valid_o.field_0._8_8_ = uStack_17b0;
                    uVar11 = movmskps((int)pIVar16,(undefined1  [16])terminated.field_0);
                    uVar11 = uVar11 ^ 0xf;
                    pIVar16 = (Intersectors *)(ulong)uVar11;
                    if (uVar11 != 0) {
                      uVar15 = (ulong)(byte)uVar11;
                      do {
                        lVar4 = 0;
                        if (uVar15 != 0) {
                          for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                          }
                        }
                        pIVar19 = (Intersectors *)&pre;
                        cVar10 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                           (pIVar19,ray,lVar4,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        if (cVar10 != '\0') {
                          valid_o.field_0.i[lVar4] = -1;
                        }
                        uVar12 = uVar15 - 1;
                        uVar15 = uVar15 & uVar12;
                        pIVar16 = extraout_RDX;
                      } while (uVar15 != 0);
                    }
                    auVar8._8_8_ = valid_o.field_0._8_8_;
                    auVar8._0_8_ = valid_o.field_0._0_8_;
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])vVar9.field_0 | auVar8);
                    iVar24 = movmskps((int)uVar12,(undefined1  [16])terminated.field_0);
                    aVar92 = _DAT_01feb9f0;
                    if (iVar24 == 0xf) {
                      iVar24 = 3;
                    }
                    else {
                      tray.tfar.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                    (undefined1  [16])terminated.field_0);
                      iVar24 = 0;
                    }
                  }
                  break;
                }
                uVar15 = root.ptr & 0xfffffffffffffff0;
                pIVar17 = (Intersectors *)0x0;
                uVar12 = 8;
                pIVar16 = pIVar19;
                aVar94 = aVar92;
                do {
                  uVar2 = *(ulong *)(uVar15 + (long)pIVar17 * 8);
                  uVar18 = uVar12;
                  pIVar19 = pIVar16;
                  aVar46 = aVar94;
                  if (uVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      fVar44 = *(float *)(root.ptr + 0x20 + (long)pIVar17 * 4);
                      fVar54 = *(float *)(root.ptr + 0x30 + (long)pIVar17 * 4);
                      fVar48 = *(float *)(root.ptr + 0x40 + (long)pIVar17 * 4);
                      fVar57 = *(float *)(root.ptr + 0x50 + (long)pIVar17 * 4);
                      fVar43 = (fVar44 - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar78 = (fVar44 - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar81 = (fVar44 - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar60 = (fVar44 - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar44 = (fVar48 - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar50 = (fVar48 - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar55 = (fVar48 - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar48 = (fVar48 - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar49 = *(float *)(root.ptr + 0x60 + (long)pIVar17 * 4);
                      fVar52 = (fVar49 - (float)tray.org.field_0._32_4_) *
                               (float)tray.rdir.field_0._32_4_;
                      fVar56 = (fVar49 - (float)tray.org.field_0._36_4_) *
                               (float)tray.rdir.field_0._36_4_;
                      fVar62 = (fVar49 - (float)tray.org.field_0._40_4_) *
                               (float)tray.rdir.field_0._40_4_;
                      fVar49 = (fVar49 - (float)tray.org.field_0._44_4_) *
                               (float)tray.rdir.field_0._44_4_;
                      fVar70 = (fVar54 - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar25 = (fVar54 - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar26 = (fVar54 - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar42 = (fVar54 - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar82 = (fVar57 - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar73 = (fVar57 - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar74 = (fVar57 - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar75 = (fVar57 - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar54 = *(float *)(root.ptr + 0x70 + (long)pIVar17 * 4);
                      auVar85._0_4_ =
                           (fVar54 - (float)tray.org.field_0._32_4_) *
                           (float)tray.rdir.field_0._32_4_;
                      auVar85._4_4_ =
                           (fVar54 - (float)tray.org.field_0._36_4_) *
                           (float)tray.rdir.field_0._36_4_;
                      auVar85._8_4_ =
                           (fVar54 - (float)tray.org.field_0._40_4_) *
                           (float)tray.rdir.field_0._40_4_;
                      auVar85._12_4_ =
                           (fVar54 - (float)tray.org.field_0._44_4_) *
                           (float)tray.rdir.field_0._44_4_;
                    }
                    else {
                      fVar44 = *(float *)(uVar15 + 0x20 + (long)pIVar17 * 4);
                      fVar48 = *(float *)(uVar15 + 0x30 + (long)pIVar17 * 4);
                      fVar49 = *(float *)(uVar15 + 0x40 + (long)pIVar17 * 4);
                      fVar50 = *(float *)(uVar15 + 0x50 + (long)pIVar17 * 4);
                      fVar52 = *(float *)(uVar15 + 0x60 + (long)pIVar17 * 4);
                      fVar54 = *(float *)(uVar15 + 0x70 + (long)pIVar17 * 4);
                      fVar55 = *(float *)(uVar15 + 0x80 + (long)pIVar17 * 4);
                      fVar56 = *(float *)(uVar15 + 0x90 + (long)pIVar17 * 4);
                      fVar57 = *(float *)(uVar15 + 0xa0 + (long)pIVar17 * 4);
                      auVar72._0_4_ =
                           (float)tray.dir.field_0._16_4_ * fVar54 +
                           (float)tray.dir.field_0._32_4_ * fVar57;
                      auVar72._4_4_ =
                           (float)tray.dir.field_0._20_4_ * fVar54 +
                           (float)tray.dir.field_0._36_4_ * fVar57;
                      auVar72._8_4_ =
                           (float)tray.dir.field_0._24_4_ * fVar54 +
                           (float)tray.dir.field_0._40_4_ * fVar57;
                      auVar72._12_4_ =
                           (float)tray.dir.field_0._28_4_ * fVar54 +
                           (float)tray.dir.field_0._44_4_ * fVar57;
                      auVar95._0_4_ =
                           fVar44 * (float)tray.dir.field_0._0_4_ +
                           fVar50 * (float)tray.dir.field_0._16_4_ +
                           fVar55 * (float)tray.dir.field_0._32_4_;
                      auVar95._4_4_ =
                           fVar44 * (float)tray.dir.field_0._4_4_ +
                           fVar50 * (float)tray.dir.field_0._20_4_ +
                           fVar55 * (float)tray.dir.field_0._36_4_;
                      auVar95._8_4_ =
                           fVar44 * (float)tray.dir.field_0._8_4_ +
                           fVar50 * (float)tray.dir.field_0._24_4_ +
                           fVar55 * (float)tray.dir.field_0._40_4_;
                      auVar95._12_4_ =
                           fVar44 * (float)tray.dir.field_0._12_4_ +
                           fVar50 * (float)tray.dir.field_0._28_4_ +
                           fVar55 * (float)tray.dir.field_0._44_4_;
                      auVar86._0_4_ =
                           fVar48 * (float)tray.dir.field_0._0_4_ +
                           fVar52 * (float)tray.dir.field_0._16_4_ +
                           fVar56 * (float)tray.dir.field_0._32_4_;
                      auVar86._4_4_ =
                           fVar48 * (float)tray.dir.field_0._4_4_ +
                           fVar52 * (float)tray.dir.field_0._20_4_ +
                           fVar56 * (float)tray.dir.field_0._36_4_;
                      auVar86._8_4_ =
                           fVar48 * (float)tray.dir.field_0._8_4_ +
                           fVar52 * (float)tray.dir.field_0._24_4_ +
                           fVar56 * (float)tray.dir.field_0._40_4_;
                      auVar86._12_4_ =
                           fVar48 * (float)tray.dir.field_0._12_4_ +
                           fVar52 * (float)tray.dir.field_0._28_4_ +
                           fVar56 * (float)tray.dir.field_0._44_4_;
                      fVar60 = (float)DAT_01ff1d40;
                      fVar62 = DAT_01ff1d40._4_4_;
                      fVar64 = DAT_01ff1d40._8_4_;
                      fVar70 = DAT_01ff1d40._12_4_;
                      auVar37._4_4_ = -(uint)(ABS(auVar95._4_4_) < fVar62);
                      auVar37._0_4_ = -(uint)(ABS(auVar95._0_4_) < fVar60);
                      auVar37._8_4_ = -(uint)(ABS(auVar95._8_4_) < fVar64);
                      auVar37._12_4_ = -(uint)(ABS(auVar95._12_4_) < fVar70);
                      auVar91 = blendvps(auVar95,_DAT_01ff1d40,auVar37);
                      auVar38._4_4_ = -(uint)(ABS(auVar86._4_4_) < fVar62);
                      auVar38._0_4_ = -(uint)(ABS(auVar86._0_4_) < fVar60);
                      auVar38._8_4_ = -(uint)(ABS(auVar86._8_4_) < fVar64);
                      auVar38._12_4_ = -(uint)(ABS(auVar86._12_4_) < fVar70);
                      auVar76 = blendvps(auVar86,_DAT_01ff1d40,auVar38);
                      auVar93._0_4_ = (float)tray.dir.field_0._0_4_ * fVar49 + auVar72._0_4_;
                      auVar93._4_4_ = (float)tray.dir.field_0._4_4_ * fVar49 + auVar72._4_4_;
                      auVar93._8_4_ = (float)tray.dir.field_0._8_4_ * fVar49 + auVar72._8_4_;
                      auVar93._12_4_ = (float)tray.dir.field_0._12_4_ * fVar49 + auVar72._12_4_;
                      auVar39._4_4_ = -(uint)(ABS(auVar93._4_4_) < fVar62);
                      auVar39._0_4_ = -(uint)(ABS(auVar93._0_4_) < fVar60);
                      auVar39._8_4_ = -(uint)(ABS(auVar93._8_4_) < fVar64);
                      auVar39._12_4_ = -(uint)(ABS(auVar93._12_4_) < fVar70);
                      auVar71 = blendvps(auVar93,_DAT_01ff1d40,auVar39);
                      auVar51 = rcpps(auVar72,auVar91);
                      fVar70 = auVar51._0_4_;
                      auVar96._0_4_ = auVar91._0_4_ * fVar70;
                      fVar25 = auVar51._4_4_;
                      auVar96._4_4_ = auVar91._4_4_ * fVar25;
                      fVar26 = auVar51._8_4_;
                      auVar96._8_4_ = auVar91._8_4_ * fVar26;
                      fVar42 = auVar51._12_4_;
                      auVar96._12_4_ = auVar91._12_4_ * fVar42;
                      fVar70 = (1.0 - auVar96._0_4_) * fVar70 + fVar70;
                      fVar25 = (1.0 - auVar96._4_4_) * fVar25 + fVar25;
                      fVar26 = (1.0 - auVar96._8_4_) * fVar26 + fVar26;
                      fVar42 = (1.0 - auVar96._12_4_) * fVar42 + fVar42;
                      auVar51 = rcpps(auVar96,auVar76);
                      fVar82 = auVar51._0_4_;
                      fVar73 = auVar51._4_4_;
                      fVar74 = auVar51._8_4_;
                      fVar75 = auVar51._12_4_;
                      fVar82 = (1.0 - auVar76._0_4_ * fVar82) * fVar82 + fVar82;
                      fVar73 = (1.0 - auVar76._4_4_ * fVar73) * fVar73 + fVar73;
                      fVar74 = (1.0 - auVar76._8_4_ * fVar74) * fVar74 + fVar74;
                      fVar75 = (1.0 - auVar76._12_4_ * fVar75) * fVar75 + fVar75;
                      auVar51 = rcpps(auVar51,auVar71);
                      fVar83 = auVar51._0_4_;
                      fVar87 = auVar51._4_4_;
                      fVar88 = auVar51._8_4_;
                      fVar89 = auVar51._12_4_;
                      fVar60 = *(float *)(uVar15 + 0xb0 + (long)pIVar17 * 4);
                      fVar83 = (1.0 - auVar71._0_4_ * fVar83) * fVar83 + fVar83;
                      fVar87 = (1.0 - auVar71._4_4_ * fVar87) * fVar87 + fVar87;
                      fVar88 = (1.0 - auVar71._8_4_ * fVar88) * fVar88 + fVar88;
                      fVar89 = (1.0 - auVar71._12_4_ * fVar89) * fVar89 + fVar89;
                      fVar62 = *(float *)(uVar15 + 0xc0 + (long)pIVar17 * 4);
                      fVar64 = *(float *)(uVar15 + 0xd0 + (long)pIVar17 * 4);
                      fVar43 = (fVar44 * (float)tray.org.field_0._0_4_ +
                               fVar50 * (float)tray.org.field_0._16_4_ +
                               fVar55 * (float)tray.org.field_0._32_4_ + fVar60) * -fVar70;
                      fVar78 = (fVar44 * (float)tray.org.field_0._4_4_ +
                               fVar50 * (float)tray.org.field_0._20_4_ +
                               fVar55 * (float)tray.org.field_0._36_4_ + fVar60) * -fVar25;
                      fVar81 = (fVar44 * (float)tray.org.field_0._8_4_ +
                               fVar50 * (float)tray.org.field_0._24_4_ +
                               fVar55 * (float)tray.org.field_0._40_4_ + fVar60) * -fVar26;
                      fVar60 = (fVar44 * (float)tray.org.field_0._12_4_ +
                               fVar50 * (float)tray.org.field_0._28_4_ +
                               fVar55 * (float)tray.org.field_0._44_4_ + fVar60) * -fVar42;
                      fVar44 = (fVar48 * (float)tray.org.field_0._0_4_ +
                               fVar52 * (float)tray.org.field_0._16_4_ +
                               fVar56 * (float)tray.org.field_0._32_4_ + fVar62) * -fVar82;
                      fVar50 = (fVar48 * (float)tray.org.field_0._4_4_ +
                               fVar52 * (float)tray.org.field_0._20_4_ +
                               fVar56 * (float)tray.org.field_0._36_4_ + fVar62) * -fVar73;
                      fVar55 = (fVar48 * (float)tray.org.field_0._8_4_ +
                               fVar52 * (float)tray.org.field_0._24_4_ +
                               fVar56 * (float)tray.org.field_0._40_4_ + fVar62) * -fVar74;
                      fVar48 = (fVar48 * (float)tray.org.field_0._12_4_ +
                               fVar52 * (float)tray.org.field_0._28_4_ +
                               fVar56 * (float)tray.org.field_0._44_4_ + fVar62) * -fVar75;
                      fVar52 = (fVar49 * (float)tray.org.field_0._0_4_ +
                               fVar54 * (float)tray.org.field_0._16_4_ +
                               fVar57 * (float)tray.org.field_0._32_4_ + fVar64) * -fVar83;
                      fVar56 = (fVar49 * (float)tray.org.field_0._4_4_ +
                               fVar54 * (float)tray.org.field_0._20_4_ +
                               fVar57 * (float)tray.org.field_0._36_4_ + fVar64) * -fVar87;
                      fVar62 = (fVar49 * (float)tray.org.field_0._8_4_ +
                               fVar54 * (float)tray.org.field_0._24_4_ +
                               fVar57 * (float)tray.org.field_0._40_4_ + fVar64) * -fVar88;
                      fVar49 = (fVar49 * (float)tray.org.field_0._12_4_ +
                               fVar54 * (float)tray.org.field_0._28_4_ +
                               fVar57 * (float)tray.org.field_0._44_4_ + fVar64) * -fVar89;
                      fVar70 = fVar70 + fVar43;
                      fVar25 = fVar25 + fVar78;
                      fVar26 = fVar26 + fVar81;
                      fVar42 = fVar42 + fVar60;
                      fVar82 = fVar82 + fVar44;
                      fVar73 = fVar73 + fVar50;
                      fVar74 = fVar74 + fVar55;
                      fVar75 = fVar75 + fVar48;
                      auVar85._0_4_ = fVar83 + fVar52;
                      auVar85._4_4_ = fVar87 + fVar56;
                      auVar85._8_4_ = fVar88 + fVar62;
                      auVar85._12_4_ = fVar89 + fVar49;
                      aVar92 = _DAT_01feb9f0;
                    }
                    uVar11 = (uint)((int)fVar70 < (int)fVar43) * (int)fVar70 |
                             (uint)((int)fVar70 >= (int)fVar43) * (int)fVar43;
                    uVar61 = (uint)((int)fVar25 < (int)fVar78) * (int)fVar25 |
                             (uint)((int)fVar25 >= (int)fVar78) * (int)fVar78;
                    uVar63 = (uint)((int)fVar26 < (int)fVar81) * (int)fVar26 |
                             (uint)((int)fVar26 >= (int)fVar81) * (int)fVar81;
                    uVar65 = (uint)((int)fVar42 < (int)fVar60) * (int)fVar42 |
                             (uint)((int)fVar42 >= (int)fVar60) * (int)fVar60;
                    uVar66 = (uint)((int)fVar82 < (int)fVar44) * (int)fVar82 |
                             (uint)((int)fVar82 >= (int)fVar44) * (int)fVar44;
                    uVar67 = (uint)((int)fVar73 < (int)fVar50) * (int)fVar73 |
                             (uint)((int)fVar73 >= (int)fVar50) * (int)fVar50;
                    uVar68 = (uint)((int)fVar74 < (int)fVar55) * (int)fVar74 |
                             (uint)((int)fVar74 >= (int)fVar55) * (int)fVar55;
                    uVar69 = (uint)((int)fVar75 < (int)fVar48) * (int)fVar75 |
                             (uint)((int)fVar75 >= (int)fVar48) * (int)fVar48;
                    uVar66 = ((int)uVar66 < (int)uVar11) * uVar11 |
                             ((int)uVar66 >= (int)uVar11) * uVar66;
                    uVar67 = ((int)uVar67 < (int)uVar61) * uVar61 |
                             ((int)uVar67 >= (int)uVar61) * uVar67;
                    uVar68 = ((int)uVar68 < (int)uVar63) * uVar63 |
                             ((int)uVar68 >= (int)uVar63) * uVar68;
                    uVar69 = ((int)uVar69 < (int)uVar65) * uVar65 |
                             ((int)uVar69 >= (int)uVar65) * uVar69;
                    iVar24 = auVar85._0_4_;
                    uVar11 = (uint)(iVar24 < (int)fVar52) * iVar24 |
                             (uint)(iVar24 >= (int)fVar52) * (int)fVar52;
                    iVar14 = auVar85._4_4_;
                    uVar61 = (uint)(iVar14 < (int)fVar56) * iVar14 |
                             (uint)(iVar14 >= (int)fVar56) * (int)fVar56;
                    iVar5 = auVar85._8_4_;
                    uVar63 = (uint)(iVar5 < (int)fVar62) * iVar5 |
                             (uint)(iVar5 >= (int)fVar62) * (int)fVar62;
                    iVar6 = auVar85._12_4_;
                    uVar65 = (uint)(iVar6 < (int)fVar49) * iVar6 |
                             (uint)(iVar6 >= (int)fVar49) * (int)fVar49;
                    auVar59._0_4_ =
                         ((int)uVar11 < (int)uVar66) * uVar66 |
                         ((int)uVar11 >= (int)uVar66) * uVar11;
                    auVar59._4_4_ =
                         ((int)uVar61 < (int)uVar67) * uVar67 |
                         ((int)uVar61 >= (int)uVar67) * uVar61;
                    auVar59._8_4_ =
                         ((int)uVar63 < (int)uVar68) * uVar68 |
                         ((int)uVar63 >= (int)uVar68) * uVar63;
                    auVar59._12_4_ =
                         ((int)uVar65 < (int)uVar69) * uVar69 |
                         ((int)uVar65 >= (int)uVar69) * uVar65;
                    uVar66 = (uint)((int)fVar43 < (int)fVar70) * (int)fVar70 |
                             (uint)((int)fVar43 >= (int)fVar70) * (int)fVar43;
                    uVar67 = (uint)((int)fVar78 < (int)fVar25) * (int)fVar25 |
                             (uint)((int)fVar78 >= (int)fVar25) * (int)fVar78;
                    uVar68 = (uint)((int)fVar81 < (int)fVar26) * (int)fVar26 |
                             (uint)((int)fVar81 >= (int)fVar26) * (int)fVar81;
                    uVar69 = (uint)((int)fVar60 < (int)fVar42) * (int)fVar42 |
                             (uint)((int)fVar60 >= (int)fVar42) * (int)fVar60;
                    uVar11 = (uint)((int)fVar44 < (int)fVar82) * (int)fVar82 |
                             (uint)((int)fVar44 >= (int)fVar82) * (int)fVar44;
                    uVar61 = (uint)((int)fVar50 < (int)fVar73) * (int)fVar73 |
                             (uint)((int)fVar50 >= (int)fVar73) * (int)fVar50;
                    uVar63 = (uint)((int)fVar55 < (int)fVar74) * (int)fVar74 |
                             (uint)((int)fVar55 >= (int)fVar74) * (int)fVar55;
                    uVar65 = (uint)((int)fVar48 < (int)fVar75) * (int)fVar75 |
                             (uint)((int)fVar48 >= (int)fVar75) * (int)fVar48;
                    uVar11 = ((int)uVar66 < (int)uVar11) * uVar66 |
                             ((int)uVar66 >= (int)uVar11) * uVar11;
                    uVar61 = ((int)uVar67 < (int)uVar61) * uVar67 |
                             ((int)uVar67 >= (int)uVar61) * uVar61;
                    uVar63 = ((int)uVar68 < (int)uVar63) * uVar68 |
                             ((int)uVar68 >= (int)uVar63) * uVar63;
                    uVar65 = ((int)uVar69 < (int)uVar65) * uVar69 |
                             ((int)uVar69 >= (int)uVar65) * uVar65;
                    uVar66 = (uint)((int)fVar52 < iVar24) * iVar24 |
                             (uint)((int)fVar52 >= iVar24) * (int)fVar52;
                    uVar67 = (uint)((int)fVar56 < iVar14) * iVar14 |
                             (uint)((int)fVar56 >= iVar14) * (int)fVar56;
                    uVar68 = (uint)((int)fVar62 < iVar5) * iVar5 |
                             (uint)((int)fVar62 >= iVar5) * (int)fVar62;
                    uVar69 = (uint)((int)fVar49 < iVar6) * iVar6 |
                             (uint)((int)fVar49 >= iVar6) * (int)fVar49;
                    uVar11 = ((int)uVar11 < (int)uVar66) * uVar11 |
                             ((int)uVar11 >= (int)uVar66) * uVar66;
                    uVar61 = ((int)uVar61 < (int)uVar67) * uVar61 |
                             ((int)uVar61 >= (int)uVar67) * uVar67;
                    uVar63 = ((int)uVar63 < (int)uVar68) * uVar63 |
                             ((int)uVar63 >= (int)uVar68) * uVar68;
                    uVar65 = ((int)uVar65 < (int)uVar69) * uVar65 |
                             ((int)uVar65 >= (int)uVar69) * uVar69;
                    auVar36._4_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar59._4_4_) *
                                         auVar59._4_4_ |
                                        (uint)(tray.tnear.field_0.i[1] >= (int)auVar59._4_4_) *
                                        tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar61) *
                                        tray.tfar.field_0.i[1] |
                                       (tray.tfar.field_0.i[1] >= (int)uVar61) * uVar61));
                    auVar36._0_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar59._0_4_) *
                                         auVar59._0_4_ |
                                        (uint)(tray.tnear.field_0.i[0] >= (int)auVar59._0_4_) *
                                        tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar11) *
                                        tray.tfar.field_0.i[0] |
                                       (tray.tfar.field_0.i[0] >= (int)uVar11) * uVar11));
                    auVar36._8_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar59._8_4_) *
                                         auVar59._8_4_ |
                                        (uint)(tray.tnear.field_0.i[2] >= (int)auVar59._8_4_) *
                                        tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar63) *
                                        tray.tfar.field_0.i[2] |
                                       (tray.tfar.field_0.i[2] >= (int)uVar63) * uVar63));
                    auVar36._12_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar59._12_4_) *
                                         auVar59._12_4_ |
                                        (uint)(tray.tnear.field_0.i[3] >= (int)auVar59._12_4_) *
                                        tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar65) *
                                        tray.tfar.field_0.i[3] |
                                       (tray.tfar.field_0.i[3] >= (int)uVar65) * uVar65));
                    uVar11 = movmskps((int)pIVar16,auVar36);
                    pIVar19 = (Intersectors *)(ulong)uVar11;
                    if ((uVar11 != 0) &&
                       (aVar46.v = (__m128)blendvps(aVar92.v,auVar59,auVar36), uVar18 = uVar2,
                       uVar12 != 8)) {
                      pNVar20->ptr = uVar12;
                      pNVar20 = pNVar20 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar94;
                      paVar21 = paVar21 + 1;
                    }
                  }
                  pIVar16 = pIVar17;
                } while ((uVar2 != 8) &&
                        (pIVar16 = (Intersectors *)
                                   ((long)(((vfloat<4> *)&pIVar17->ptr)->field_0).v + 1),
                        bVar23 = pIVar17 < (Intersectors *)0x3, pIVar17 = pIVar16, uVar12 = uVar18,
                        pIVar19 = pIVar16, aVar94 = aVar46, bVar23));
                iVar24 = 0;
                if (uVar18 == 8) {
LAB_0024f82d:
                  bVar23 = false;
                  iVar24 = 4;
                }
                else {
                  auVar40._4_4_ = -(uint)(aVar46.v[1] < tray.tfar.field_0.v[1]);
                  auVar40._0_4_ = -(uint)(aVar46.v[0] < tray.tfar.field_0.v[0]);
                  auVar40._8_4_ = -(uint)(aVar46.v[2] < tray.tfar.field_0.v[2]);
                  auVar40._12_4_ = -(uint)(aVar46.v[3] < tray.tfar.field_0.v[3]);
                  uVar13 = movmskps((int)uVar15,auVar40);
                  pIVar16 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar13);
                  bVar23 = true;
                  if (pIVar16 <= pIVar22) {
                    pNVar20->ptr = uVar18;
                    pNVar20 = pNVar20 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar46;
                    paVar21 = paVar21 + 1;
                    goto LAB_0024f82d;
                  }
                }
                root.ptr = uVar18;
              } while (bVar23);
            }
          }
        }
      } while (iVar24 != 3);
      auVar47._0_4_ = auVar45._0_4_ & terminated.field_0.i[0];
      auVar47._4_4_ = auVar45._4_4_ & terminated.field_0.i[1];
      auVar47._8_4_ = auVar45._8_4_ & terminated.field_0.i[2];
      auVar47._12_4_ = auVar45._12_4_ & terminated.field_0.i[3];
      auVar47 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar47);
      *(undefined1 (*) [16])(ray + 0x80) = auVar47;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }